

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O0

void * tc_memalign(size_t align,size_t size)

{
  void *p;
  size_t size_local;
  size_t align_local;
  memalign_retry_data data;
  void *p_1;
  void *local_10;
  
  data._16_8_ = do_debug_memalign(align,size,-0x10325470);
  local_10 = (void *)data._16_8_;
  if ((void *)data._16_8_ == (void *)0x0) {
    data.size._0_4_ = 0xefcdab90;
    align_local = align;
    data.align = size;
    local_10 = anon_unknown.dwarf_5682::handle_oom(retry_debug_memalign,&align_local,false,true);
  }
  tcmalloc::InvokeNewHook(local_10,size);
  return local_10;
}

Assistant:

PERFTOOLS_DLL_DECL void* tc_memalign(size_t align, size_t size) PERFTOOLS_NOTHROW {
  void *p = do_debug_memalign_or_debug_cpp_memalign(align, size, MallocBlock::kMallocType, false, true);
  tcmalloc::InvokeNewHook(p, size);
  return p;
}